

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# one.hpp
# Opt level: O0

bool tao::pegtl::internal::
     one<(tao::pegtl::internal::result_on_found)1,tao::pegtl::internal::peek_char,(char)101,(char)69>
     ::
     match<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>
               (memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *in)

{
  bool bVar1;
  char local_3a [2];
  initializer_list<char> local_38;
  pair_t local_22;
  size_t sStack_20;
  pair_t t;
  size_t s;
  memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_local;
  
  sStack_20 = memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::size(in,1);
  if (sStack_20 != 0) {
    local_22 = peek_char::
               peek<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>
                         (in,sStack_20);
    bVar1 = input_pair::operator_cast_to_bool((input_pair *)&local_22);
    if (bVar1) {
      local_3a[0] = 'e';
      local_3a[1] = 0x45;
      local_38._M_array = local_3a;
      local_38._M_len = 2;
      bVar1 = contains<char>(local_22.data,&local_38);
      if (bVar1) {
        bump_help<(tao::pegtl::internal::result_on_found)1,_tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,__e_,__E_>
                  (in,(ulong)local_22.size);
        return true;
      }
    }
  }
  return false;
}

Assistant:

static bool match( Input& in ) noexcept( noexcept( in.size( Peek::max_input_size ) ) )
            {
               const std::size_t s = in.size( Peek::max_input_size );
               if( s >= Peek::min_input_size ) {
                  if( const auto t = Peek::peek( in, s ) ) {
                     if( contains( t.data, { Cs... } ) == bool( R ) ) {
                        bump_help< R, Input, typename Peek::data_t, Cs... >( in, t.size );
                        return true;
                     }
                  }
               }
               return false;
            }